

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::vector
          (vector<double,_pstd::pmr::polymorphic_allocator<double>_> *this,
          vector<double,_pstd::pmr::polymorphic_allocator<double>_> *other,
          polymorphic_allocator<double> *alloc)

{
  size_t sVar1;
  double *pdVar2;
  double *pdVar3;
  size_t sVar4;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->ptr = (double *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  reserve(this,other->nStored);
  sVar1 = other->nStored;
  if (sVar1 != 0) {
    pdVar2 = other->ptr;
    sVar4 = 0;
    pdVar3 = this->ptr;
    do {
      pdVar3[sVar4] = pdVar2[sVar4];
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  this->nStored = sVar1;
  return;
}

Assistant:

vector(const vector &other, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            this->alloc.template construct<T>(ptr + i, other[i]);
        nStored = other.size();
    }